

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

bool spvtools::utils::
     RejectParseDueToLeadingSign<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
               (istream *is,bool negate_value,
               HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
               *value)

{
  int iVar1;
  undefined7 in_register_00000031;
  bool bVar2;
  
  if ((int)CONCAT71(in_register_00000031,negate_value) != 0) {
    iVar1 = std::istream::peek();
    if ((iVar1 == 0x2d) || (iVar1 == 0x2b)) {
      (value->value_).data_ = 0;
      std::ios::setstate((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
      bVar2 = (iVar1 - 0x2bU & 0xfffffffd) == 0;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

inline bool RejectParseDueToLeadingSign(std::istream& is, bool negate_value,
                                        HexFloat<T, Traits>& value) {
  if (negate_value) {
    auto next_char = is.peek();
    if (next_char == '-' || next_char == '+') {
      // Fail the parse.  Emulate standard behaviour by setting the value to
      // the zero value, and set the fail bit on the stream.
      value = HexFloat<T, Traits>(typename HexFloat<T, Traits>::uint_type{0});
      is.setstate(std::ios_base::failbit);
      return true;
    }
  }
  return false;
}